

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

int __thiscall
TPZMatrix<std::complex<float>_>::Inverse
          (TPZMatrix<std::complex<float>_> *this,TPZFMatrix<std::complex<float>_> *Inv,
          DecomposeType dec)

{
  _func_int **pp_Var1;
  _func_int *UNRECOVERED_JUMPTABLE;
  int iVar2;
  complex<float> *pcVar3;
  ostream *poVar4;
  long row;
  long lVar5;
  undefined8 uStack_30;
  
  lVar5 = (this->super_TPZBaseMatrix).fRow;
  if (lVar5 != 0) {
    if (lVar5 == (this->super_TPZBaseMatrix).fCol) {
      (*(Inv->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
        _vptr_TPZSavable[0xe])(Inv,lVar5,lVar5);
      (*(Inv->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
        _vptr_TPZSavable[0xf])(Inv);
      row = 0;
      if (lVar5 < 1) {
        lVar5 = row;
      }
      for (; lVar5 != row; row = row + 1) {
        pcVar3 = TPZFMatrix<std::complex<float>_>::operator()(Inv,row,row);
        pcVar3->_M_value = 0x3f800000;
      }
      pp_Var1 = (this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable;
      if (dec == ENoDecompose) {
        iVar2 = (*pp_Var1[0x10])(this);
        UNRECOVERED_JUMPTABLE = (this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x41];
        if (iVar2 == 0) {
          uStack_30 = 1;
        }
        else {
          uStack_30 = 4;
        }
        iVar2 = (*UNRECOVERED_JUMPTABLE)(this,Inv,uStack_30,UNRECOVERED_JUMPTABLE);
        return iVar2;
      }
      (*pp_Var1[0x41])(this,Inv,(ulong)dec);
    }
    else {
      poVar4 = std::operator<<((ostream *)&std::cerr,
                               "int TPZMatrix<std::complex<float>>::Inverse(TPZFMatrix<TVar> &, DecomposeType) [TVar = std::complex<float>]"
                              );
      poVar4 = std::operator<<(poVar4," - matrix must be square - Rows() = ");
      poVar4 = std::ostream::_M_insert<long>((long)poVar4);
      poVar4 = std::operator<<(poVar4," - Cols() = ");
      poVar4 = std::ostream::_M_insert<long>((long)poVar4);
      std::endl<char,std::char_traits<char>>(poVar4);
    }
  }
  return 0;
}

Assistant:

const TPZFMatrix<TVar> TPZMatrix<TVar>::Storage() const
{
  const auto size = Size();
  const auto elem = Elem();
	TPZFMatrix<TVar> ref(size,1,const_cast<TVar*>(elem),size);
	return ref;
}